

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O1

void aom_highbd_quantize_b_32x32_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint *puVar1;
  int *piVar2;
  uint *puVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  ulong uVar39;
  uint16_t uVar40;
  short *psVar41;
  ulong uVar42;
  undefined4 in_R11D;
  long lVar43;
  bool bVar44;
  ushort uVar45;
  short sVar48;
  int iVar46;
  ushort uVar49;
  ushort uVar50;
  int iVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  undefined1 auVar47 [16];
  ushort uVar56;
  ushort uVar57;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar77;
  undefined1 auVar76 [16];
  int iVar78;
  uint uVar79;
  uint uVar86;
  uint uVar87;
  undefined1 auVar80 [16];
  uint uVar88;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  int iVar103;
  int iVar109;
  int iVar110;
  int iVar111;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  uint uVar112;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  uint uVar143;
  uint uVar144;
  undefined1 auVar140 [16];
  uint uVar145;
  uint uVar146;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  uint uVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  int iVar156;
  int iVar159;
  int iVar160;
  int iVar161;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  uint uVar162;
  uint uVar167;
  uint uVar168;
  undefined1 auVar163 [16];
  uint uVar169;
  uint uVar170;
  undefined1 auVar166 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 local_148 [16];
  undefined8 local_110 [30];
  __m128i sign_hi_4;
  __m128i sign_lo_4;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  
  auVar58 = psraw(ZEXT416(*(uint *)zbin_ptr),1);
  auVar47 = ZEXT416(*(uint *)zbin_ptr) & _DAT_0050f280;
  sVar48 = auVar47._2_2_ + auVar58._2_2_;
  auVar33._4_8_ =
       (long)(((unkuint10)
               (uint6)(((unkuint10)CONCAT22(auVar58._6_2_,auVar58._6_2_) << 0x30) >> 0x20) << 0x20)
             >> 0x10);
  auVar33._2_2_ = sVar48;
  auVar33._0_2_ = sVar48;
  iVar46 = (int)(short)(auVar47._0_2_ + auVar58._0_2_);
  iVar51 = auVar33._0_4_ >> 0x10;
  local_110[0] = CONCAT44(iVar51,iVar46);
  auVar47 = pshuflw(ZEXT416(*(uint *)dequant_ptr),ZEXT416(*(uint *)dequant_ptr),0xd4);
  auVar59 = pmaddwd(auVar47,_DAT_0050e5a0);
  auVar89._8_4_ = 0xffffffff;
  auVar89._0_8_ = 0xffffffffffffffff;
  auVar89._12_4_ = 0xffffffff;
  iVar51 = iVar51 * 0x20 + -1 + (auVar59._4_4_ + 0x40 >> 7);
  auVar47 = *(undefined1 (*) [16])zbin_ptr;
  auVar58 = *(undefined1 (*) [16])round_ptr;
  auVar177 = *(undefined1 (*) [16])quant_ptr;
  auVar64 = *(undefined1 (*) [16])dequant_ptr;
  auVar90 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar76 = psraw(auVar47,0xf);
  auVar80 = psraw(auVar58,0xf);
  auVar171._0_12_ = auVar47._0_12_;
  auVar171._12_2_ = auVar47._6_2_;
  auVar171._14_2_ = auVar76._6_2_;
  auVar154._12_4_ = auVar171._12_4_;
  auVar154._0_10_ = auVar47._0_10_;
  auVar154._10_2_ = auVar76._4_2_;
  auVar176._10_6_ = auVar154._10_6_;
  auVar176._0_8_ = auVar47._0_8_;
  auVar176._8_2_ = auVar47._4_2_;
  auVar34._4_8_ = auVar176._8_8_;
  auVar34._2_2_ = auVar76._2_2_;
  auVar34._0_2_ = auVar47._2_2_;
  auVar165._0_12_ = auVar58._0_12_;
  auVar165._12_2_ = auVar58._6_2_;
  auVar165._14_2_ = auVar80._6_2_;
  auVar164._12_4_ = auVar165._12_4_;
  auVar164._0_10_ = auVar58._0_10_;
  auVar164._10_2_ = auVar80._4_2_;
  auVar163._10_6_ = auVar164._10_6_;
  auVar163._0_8_ = auVar58._0_8_;
  auVar163._8_2_ = auVar58._4_2_;
  auVar35._4_8_ = auVar163._8_8_;
  auVar35._2_2_ = auVar80._2_2_;
  auVar35._0_2_ = auVar58._2_2_;
  uVar150 = auVar176._8_4_ + 1U >> 1;
  uVar152 = auVar154._12_4_ + 1U >> 1;
  iVar77 = uVar150 - 1;
  iVar78 = uVar152 - 1;
  uVar112 = *coeff_ptr >> 0x1f;
  uVar126 = coeff_ptr[1] >> 0x1f;
  uVar127 = coeff_ptr[2] >> 0x1f;
  uVar128 = coeff_ptr[3] >> 0x1f;
  uVar79 = coeff_ptr[4] >> 0x1f;
  uVar86 = coeff_ptr[5] >> 0x1f;
  uVar87 = coeff_ptr[6] >> 0x1f;
  uVar88 = coeff_ptr[7] >> 0x1f;
  iVar156 = (*coeff_ptr ^ uVar112) - uVar112;
  iVar159 = (coeff_ptr[1] ^ uVar126) - uVar126;
  iVar160 = (coeff_ptr[2] ^ uVar127) - uVar127;
  iVar161 = (coeff_ptr[3] ^ uVar128) - uVar128;
  iVar103 = (coeff_ptr[4] ^ uVar79) - uVar79;
  iVar109 = (coeff_ptr[5] ^ uVar86) - uVar86;
  iVar110 = (coeff_ptr[6] ^ uVar87) - uVar87;
  iVar111 = (coeff_ptr[7] ^ uVar88) - uVar88;
  auVar59._0_4_ = -(uint)(iVar46 * 0x20 + -1 + (auVar59._0_4_ + 0x40 >> 7) < iVar156 * 0x20);
  auVar59._4_4_ = -(uint)(iVar51 < iVar159 * 0x20);
  auVar59._8_4_ = -(uint)(iVar51 < iVar160 * 0x20);
  auVar59._12_4_ = -(uint)(iVar51 < iVar161 * 0x20);
  auVar113._0_4_ = -(uint)(iVar51 < iVar103 * 0x20);
  auVar113._4_4_ = -(uint)(iVar51 < iVar109 * 0x20);
  auVar113._8_4_ = -(uint)(iVar51 < iVar110 * 0x20);
  auVar113._12_4_ = -(uint)(iVar51 < iVar111 * 0x20);
  auVar113 = packssdw(auVar59,auVar113);
  auVar59 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  bVar24 = (auVar113 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar25 = (auVar113 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar23 = (auVar113 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar113 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar113 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar113 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar113 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar113 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar15 = (auVar113 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar14 = (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar13 = (auVar113 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar12 = (auVar113 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar11 = (auVar113 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar44 = auVar113[0xf] < '\0';
  if (((((((((((((((bVar24 || bVar25) || bVar23) || bVar22) || bVar21) || bVar20) || bVar19) ||
             bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) ||
      bVar44) {
    local_148 = auVar113 & *(undefined1 (*) [16])iscan;
  }
  bVar44 = ((((((((((((((bVar24 || bVar25) || bVar23) || bVar22) || bVar21) || bVar20) || bVar19) ||
                  bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) ||
           bVar11) || bVar44;
  auVar154 = psraw(auVar177,0xf);
  auVar176 = psraw(auVar64,0xf);
  auVar113 = psraw(auVar90,0xf);
  auVar47._0_4_ = -(uint)(iVar156 < (int)(CONCAT22(auVar76._0_2_,auVar47._0_2_) + 1U >> 1));
  auVar47._4_4_ = -(uint)(iVar159 < (int)(auVar34._0_4_ + 1U >> 1));
  auVar47._8_4_ = -(uint)(iVar160 < (int)uVar150);
  auVar47._12_4_ = -(uint)(iVar161 < (int)uVar152);
  auVar76._0_4_ = -(uint)(iVar77 < iVar103);
  auVar76._4_4_ = -(uint)(iVar78 < iVar109);
  auVar76._8_4_ = -(uint)(iVar77 < iVar110);
  auVar76._12_4_ = -(uint)(iVar78 < iVar111);
  auVar171 = packssdw(auVar89 ^ auVar47,auVar76);
  bVar25 = (auVar171 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar26 = (auVar171 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar171 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar23 = (auVar171 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar171 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar171 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar171 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar171 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar171 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar171 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar171 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar15 = (auVar171 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar14 = (auVar171 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar13 = (auVar171 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar12 = (auVar171 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar11 = auVar171[0xf] < '\0';
  if (((((((((((((((bVar25 || bVar26) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) ||
             bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) ||
      bVar11) {
    auVar59 = auVar171 & *(undefined1 (*) [16])iscan;
  }
  bVar11 = ((((((((((((((bVar25 || bVar26) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) ||
                  bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) ||
           bVar12) || bVar11;
  auVar62._0_12_ = auVar177._0_12_;
  auVar62._12_2_ = auVar177._6_2_;
  auVar62._14_2_ = auVar154._6_2_;
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._0_10_ = auVar177._0_10_;
  auVar61._10_2_ = auVar154._4_2_;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._0_8_ = auVar177._0_8_;
  auVar60._8_2_ = auVar177._4_2_;
  auVar36._4_8_ = auVar60._8_8_;
  auVar36._2_2_ = auVar154._2_2_;
  auVar36._0_2_ = auVar177._2_2_;
  auVar177._2_2_ = auVar154._0_2_;
  auVar177._4_12_ = auVar36;
  auVar142._0_12_ = auVar64._0_12_;
  auVar142._12_2_ = auVar64._6_2_;
  auVar142._14_2_ = auVar176._6_2_;
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._0_10_ = auVar64._0_10_;
  auVar141._10_2_ = auVar176._4_2_;
  auVar140._10_6_ = auVar141._10_6_;
  auVar140._0_8_ = auVar64._0_8_;
  auVar140._8_2_ = auVar64._4_2_;
  auVar37._4_8_ = auVar140._8_8_;
  auVar37._2_2_ = auVar176._2_2_;
  auVar37._0_2_ = auVar64._2_2_;
  auVar118._0_2_ = auVar64._0_2_;
  auVar118._2_2_ = auVar176._0_2_;
  auVar118._4_12_ = auVar37;
  auVar131._0_12_ = auVar90._0_12_;
  auVar131._12_2_ = auVar90._6_2_;
  auVar131._14_2_ = auVar113._6_2_;
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._0_10_ = auVar90._0_10_;
  auVar130._10_2_ = auVar113._4_2_;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._0_8_ = auVar90._0_8_;
  auVar129._8_2_ = auVar90._4_2_;
  auVar38._4_8_ = auVar129._8_8_;
  auVar38._2_2_ = auVar113._2_2_;
  auVar38._0_2_ = auVar90._2_2_;
  auVar173._0_2_ = auVar90._0_2_;
  auVar173._2_2_ = auVar113._0_2_;
  auVar173._4_12_ = auVar38;
  uVar168 = auVar163._8_4_ + 1U >> 1;
  uVar169 = auVar164._12_4_ + 1U >> 1;
  iVar46 = movmskps(in_R11D,auVar89 ^ auVar47 | auVar76);
  uVar150 = auVar60._8_4_;
  uVar152 = auVar129._8_4_;
  uVar143 = auVar140._8_4_;
  auVar90._8_4_ = (int)uVar150 >> 0x1f;
  auVar90._12_4_ = (int)auVar61._12_4_ >> 0x1f;
  auVar92._8_4_ = (int)uVar152 >> 0x1f;
  auVar92._12_4_ = (int)auVar130._12_4_ >> 0x1f;
  auVar64._8_4_ = (int)uVar143 >> 0x1f;
  auVar64._12_4_ = (int)auVar141._12_4_ >> 0x1f;
  if (iVar46 == 0) {
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
  }
  else {
    auVar157._0_4_ = iVar156 + (CONCAT22(auVar80._0_2_,auVar58._0_2_) + 1U >> 1);
    auVar157._4_4_ = iVar159 + (auVar35._0_4_ + 1U >> 1);
    auVar157._8_4_ = iVar160 + uVar168;
    auVar157._12_4_ = iVar161 + uVar169;
    auVar90._0_4_ = (int)auVar154._0_2_ >> 0xf;
    auVar90._4_4_ = auVar36._0_4_ >> 0x1f;
    auVar114._0_8_ = CONCAT44(auVar90._0_4_,auVar90._0_4_);
    auVar114._8_4_ = auVar90._4_4_;
    auVar114._12_4_ = auVar90._4_4_;
    auVar172._0_8_ = CONCAT44(auVar90._8_4_,auVar90._8_4_);
    auVar172._8_4_ = auVar90._12_4_;
    auVar172._12_4_ = auVar90._12_4_;
    auVar177 = auVar177 ^ auVar90;
    auVar178._0_4_ = auVar177._0_4_ - auVar90._0_4_;
    auVar178._4_4_ = auVar177._4_4_ - auVar90._4_4_;
    auVar178._8_4_ = auVar177._8_4_ - auVar90._8_4_;
    auVar178._12_4_ = auVar177._12_4_ - auVar90._12_4_;
    auVar91._0_8_ = (ulong)auVar157._0_4_ * (ulong)auVar178._0_4_;
    auVar91._8_8_ = (auVar157._8_8_ & 0xffffffff) * (ulong)auVar178._8_4_;
    auVar179._0_8_ = (ulong)auVar178._4_4_ * (ulong)auVar157._4_4_;
    auVar179._8_8_ = (auVar178._8_8_ >> 0x20) * (auVar157._8_8_ >> 0x20);
    auVar81._0_4_ =
         (int)((ulong)(SUB168(auVar91 ^ auVar114,0) - auVar114._0_8_) >> 0x10) + auVar157._0_4_;
    auVar81._4_4_ =
         (int)((ulong)(SUB168(auVar179 ^ auVar172,0) - auVar172._0_8_) >> 0x10) + auVar157._4_4_;
    auVar81._8_4_ =
         (int)((ulong)(SUB168(auVar91 ^ auVar114,8) - auVar114._8_8_) >> 0x10) + auVar157._8_4_;
    auVar81._12_4_ =
         (int)((ulong)(SUB168(auVar179 ^ auVar172,8) - auVar172._8_8_) >> 0x10) + auVar157._12_4_;
    auVar92._0_4_ = (int)auVar113._0_2_ >> 0xf;
    auVar92._4_4_ = auVar38._0_4_ >> 0x1f;
    auVar115._0_8_ = CONCAT44(auVar92._0_4_,auVar92._0_4_);
    auVar115._8_4_ = auVar92._4_4_;
    auVar115._12_4_ = auVar92._4_4_;
    auVar158._0_8_ = CONCAT44(auVar92._8_4_,auVar92._8_4_);
    auVar158._8_4_ = auVar92._12_4_;
    auVar158._12_4_ = auVar92._12_4_;
    auVar173 = auVar173 ^ auVar92;
    auVar174._0_4_ = auVar173._0_4_ - auVar92._0_4_;
    auVar174._4_4_ = auVar173._4_4_ - auVar92._4_4_;
    auVar174._8_4_ = auVar173._8_4_ - auVar92._8_4_;
    auVar174._12_4_ = auVar173._12_4_ - auVar92._12_4_;
    auVar93._0_8_ = (ulong)auVar81._0_4_ * (ulong)auVar174._0_4_;
    auVar93._8_8_ = (auVar81._8_8_ & 0xffffffff) * (ulong)auVar174._8_4_;
    auVar175._0_8_ = (ulong)auVar174._4_4_ * (ulong)auVar81._4_4_;
    auVar175._8_8_ = (auVar174._8_8_ >> 0x20) * (auVar81._8_8_ >> 0x20);
    auVar104._0_4_ = iVar103 + uVar168;
    auVar104._4_4_ = iVar109 + uVar169;
    auVar104._8_4_ = iVar110 + uVar168;
    auVar104._12_4_ = iVar111 + uVar169;
    auVar94._0_8_ = CONCAT44(auVar90._8_4_,auVar90._8_4_);
    auVar94._8_4_ = auVar90._12_4_;
    auVar94._12_4_ = auVar90._12_4_;
    auVar116._0_8_ = CONCAT44(auVar90._8_4_,auVar90._8_4_);
    auVar116._8_4_ = auVar90._12_4_;
    auVar116._12_4_ = auVar90._12_4_;
    auVar132._0_4_ = (uVar150 ^ auVar90._8_4_) - auVar90._8_4_;
    auVar132._4_4_ = (auVar61._12_4_ ^ auVar90._12_4_) - auVar90._12_4_;
    auVar132._8_4_ = (uVar150 ^ auVar90._8_4_) - auVar90._8_4_;
    auVar132._12_4_ = (auVar61._12_4_ ^ auVar90._12_4_) - auVar90._12_4_;
    auVar58._0_8_ = (ulong)auVar104._0_4_ * (ulong)auVar132._0_4_;
    auVar58._8_8_ = (auVar104._8_8_ & 0xffffffff) * (ulong)auVar132._8_4_;
    auVar133._0_8_ = (ulong)auVar132._4_4_ * (ulong)auVar104._4_4_;
    auVar133._8_8_ = (auVar132._8_8_ >> 0x20) * (auVar104._8_8_ >> 0x20);
    auVar80._0_4_ =
         (int)((ulong)(SUB168(auVar58 ^ auVar94,0) - auVar94._0_8_) >> 0x10) + auVar104._0_4_;
    auVar80._4_4_ =
         (int)((ulong)(SUB168(auVar133 ^ auVar116,0) - auVar116._0_8_) >> 0x10) + auVar104._4_4_;
    auVar80._8_4_ =
         (int)((ulong)(SUB168(auVar58 ^ auVar94,8) - auVar94._8_8_) >> 0x10) + auVar104._8_4_;
    auVar80._12_4_ =
         (int)((ulong)(SUB168(auVar133 ^ auVar116,8) - auVar116._8_8_) >> 0x10) + auVar104._12_4_;
    auVar105._0_8_ = CONCAT44(auVar92._8_4_,auVar92._8_4_);
    auVar105._8_4_ = auVar92._12_4_;
    auVar105._12_4_ = auVar92._12_4_;
    auVar117._0_8_ = CONCAT44(auVar92._8_4_,auVar92._8_4_);
    auVar117._8_4_ = auVar92._12_4_;
    auVar117._12_4_ = auVar92._12_4_;
    auVar134._0_4_ = (uVar152 ^ auVar92._8_4_) - auVar92._8_4_;
    auVar134._4_4_ = (auVar130._12_4_ ^ auVar92._12_4_) - auVar92._12_4_;
    auVar134._8_4_ = (uVar152 ^ auVar92._8_4_) - auVar92._8_4_;
    auVar134._12_4_ = (auVar130._12_4_ ^ auVar92._12_4_) - auVar92._12_4_;
    auVar95._0_8_ = (ulong)auVar80._0_4_ * (ulong)auVar134._0_4_;
    auVar95._8_8_ = (auVar80._8_8_ & 0xffffffff) * (ulong)auVar134._8_4_;
    auVar135._0_8_ = (ulong)auVar134._4_4_ * (ulong)auVar80._4_4_;
    auVar135._8_8_ = (auVar134._8_8_ >> 0x20) * (auVar80._8_8_ >> 0x20);
    auVar147._0_4_ =
         ((uint)((ulong)(SUB168(auVar93 ^ auVar115,0) - auVar115._0_8_) >> 0xf) ^ uVar112) - uVar112
    ;
    auVar147._4_4_ =
         ((uint)((ulong)((SUB168(auVar175 ^ auVar158,0) - auVar158._0_8_) * 0x20000) >> 0x20) ^
         uVar126) - uVar126;
    auVar147._8_4_ =
         ((uint)((ulong)(SUB168(auVar93 ^ auVar115,8) - auVar115._8_8_) >> 0xf) ^ uVar127) - uVar127
    ;
    auVar147._12_4_ =
         ((uint)((ulong)((SUB168(auVar175 ^ auVar158,8) - auVar158._8_8_) * 0x20000) >> 0x20) ^
         uVar128) - uVar128;
    auVar63._0_4_ =
         ((uint)((ulong)(SUB168(auVar95 ^ auVar105,0) - auVar105._0_8_) >> 0xf) ^ uVar79) - uVar79;
    auVar63._4_4_ =
         ((uint)((ulong)((SUB168(auVar135 ^ auVar117,0) - auVar117._0_8_) * 0x20000) >> 0x20) ^
         uVar86) - uVar86;
    auVar63._8_4_ =
         ((uint)((ulong)(SUB168(auVar95 ^ auVar105,8) - auVar105._8_8_) >> 0xf) ^ uVar87) - uVar87;
    auVar63._12_4_ =
         ((uint)((ulong)((SUB168(auVar135 ^ auVar117,8) - auVar117._8_8_) * 0x20000) >> 0x20) ^
         uVar88) - uVar88;
    auVar147 = ~auVar47 & auVar147;
    auVar76 = auVar76 & auVar63;
    *(undefined1 (*) [16])qcoeff_ptr = auVar147;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = auVar76;
    auVar82._0_4_ = auVar147._0_4_ >> 0x1f;
    auVar82._4_4_ = auVar147._4_4_ >> 0x1f;
    auVar82._8_4_ = auVar147._8_4_ >> 0x1f;
    auVar82._12_4_ = auVar147._12_4_ >> 0x1f;
    auVar147 = auVar147 ^ auVar82;
    auVar148._0_4_ = auVar147._0_4_ - auVar82._0_4_;
    auVar148._4_4_ = auVar147._4_4_ - auVar82._4_4_;
    auVar148._8_4_ = auVar147._8_4_ - auVar82._8_4_;
    auVar148._12_4_ = auVar147._12_4_ - auVar82._12_4_;
    auVar64._0_4_ = (int)auVar176._0_2_ >> 0xf;
    auVar64._4_4_ = auVar37._0_4_ >> 0x1f;
    auVar96._0_8_ = CONCAT44(auVar64._0_4_,auVar64._0_4_);
    auVar96._8_4_ = auVar64._4_4_;
    auVar96._12_4_ = auVar64._4_4_;
    auVar106._0_8_ = CONCAT44(auVar64._8_4_,auVar64._8_4_);
    auVar106._8_4_ = auVar64._12_4_;
    auVar106._12_4_ = auVar64._12_4_;
    auVar118 = auVar118 ^ auVar64;
    auVar119._0_4_ = auVar118._0_4_ - auVar64._0_4_;
    auVar119._4_4_ = auVar118._4_4_ - auVar64._4_4_;
    auVar119._8_4_ = auVar118._8_4_ - auVar64._8_4_;
    auVar119._12_4_ = auVar118._12_4_ - auVar64._12_4_;
    auVar65._0_8_ = (ulong)auVar148._0_4_ * (ulong)auVar119._0_4_;
    auVar65._8_8_ = (auVar148._8_8_ & 0xffffffff) * (ulong)auVar119._8_4_;
    auVar120._0_8_ = (ulong)auVar119._4_4_ * (ulong)auVar148._4_4_;
    auVar120._8_8_ = (auVar119._8_8_ >> 0x20) * (auVar148._8_8_ >> 0x20);
    auVar67._0_4_ = (undefined4)((ulong)(SUB168(auVar65 ^ auVar96,0) - auVar96._0_8_) >> 1);
    auVar66._8_4_ = (undefined4)((ulong)(SUB168(auVar65 ^ auVar96,8) - auVar96._8_8_) >> 1);
    auVar66._4_4_ = auVar66._8_4_;
    auVar66._0_4_ = auVar67._0_4_;
    auVar66._12_4_ =
         (int)((ulong)((SUB168(auVar120 ^ auVar106,8) - auVar106._8_8_) * 0x80000000) >> 0x20);
    auVar67._8_8_ = auVar66._8_8_;
    auVar67._4_4_ =
         (int)((ulong)((SUB168(auVar120 ^ auVar106,0) - auVar106._0_8_) * 0x80000000) >> 0x20);
    auVar67 = auVar67 ^ auVar82;
    auVar83._0_4_ = auVar76._0_4_ >> 0x1f;
    auVar83._4_4_ = auVar76._4_4_ >> 0x1f;
    auVar83._8_4_ = auVar76._8_4_ >> 0x1f;
    auVar83._12_4_ = auVar76._12_4_ >> 0x1f;
    auVar76 = auVar76 ^ auVar83;
    auVar155._0_4_ = auVar76._0_4_ - auVar83._0_4_;
    auVar155._4_4_ = auVar76._4_4_ - auVar83._4_4_;
    auVar155._8_4_ = auVar76._8_4_ - auVar83._8_4_;
    auVar155._12_4_ = auVar76._12_4_ - auVar83._12_4_;
    auVar107._0_8_ = CONCAT44(auVar64._8_4_,auVar64._8_4_);
    auVar107._8_4_ = auVar64._12_4_;
    auVar107._12_4_ = auVar64._12_4_;
    auVar121._0_8_ = CONCAT44(auVar64._8_4_,auVar64._8_4_);
    auVar121._8_4_ = auVar64._12_4_;
    auVar121._12_4_ = auVar64._12_4_;
    auVar136._0_4_ = (uVar143 ^ auVar64._8_4_) - auVar64._8_4_;
    auVar136._4_4_ = (auVar141._12_4_ ^ auVar64._12_4_) - auVar64._12_4_;
    auVar136._8_4_ = (uVar143 ^ auVar64._8_4_) - auVar64._8_4_;
    auVar136._12_4_ = (auVar141._12_4_ ^ auVar64._12_4_) - auVar64._12_4_;
    auVar97._0_8_ = (ulong)auVar155._0_4_ * (ulong)auVar136._0_4_;
    auVar97._8_8_ = (auVar155._8_8_ & 0xffffffff) * (ulong)auVar136._8_4_;
    auVar137._0_8_ = (ulong)auVar136._4_4_ * (ulong)auVar155._4_4_;
    auVar137._8_8_ = (auVar136._8_8_ >> 0x20) * (auVar155._8_8_ >> 0x20);
    auVar99._0_4_ = (undefined4)((ulong)(SUB168(auVar97 ^ auVar107,0) - auVar107._0_8_) >> 1);
    auVar98._8_4_ = (undefined4)((ulong)(SUB168(auVar97 ^ auVar107,8) - auVar107._8_8_) >> 1);
    auVar98._4_4_ = auVar98._8_4_;
    auVar98._0_4_ = auVar99._0_4_;
    auVar98._12_4_ =
         (int)((ulong)((SUB168(auVar137 ^ auVar121,8) - auVar121._8_8_) * 0x80000000) >> 0x20);
    auVar99._8_8_ = auVar98._8_8_;
    auVar99._4_4_ =
         (int)((ulong)((SUB168(auVar137 ^ auVar121,0) - auVar121._0_8_) * 0x80000000) >> 0x20);
    auVar99 = auVar99 ^ auVar83;
    *dqcoeff_ptr = auVar67._0_4_ - auVar82._0_4_;
    dqcoeff_ptr[1] = auVar67._4_4_ - auVar82._4_4_;
    dqcoeff_ptr[2] = auVar67._8_4_ - auVar82._8_4_;
    dqcoeff_ptr[3] = auVar67._12_4_ - auVar82._12_4_;
    dqcoeff_ptr[4] = auVar99._0_4_ - auVar83._0_4_;
    dqcoeff_ptr[5] = auVar99._4_4_ - auVar83._4_4_;
    dqcoeff_ptr[6] = auVar99._8_4_ - auVar83._8_4_;
    dqcoeff_ptr[7] = auVar99._12_4_ - auVar83._12_4_;
  }
  local_148._2_2_ = (ushort)(-1 < (short)local_148._2_2_) * local_148._2_2_;
  local_148._0_2_ = (ushort)(-1 < (short)local_148._0_2_) * local_148._0_2_;
  local_148._4_2_ = (ushort)(-1 < (short)local_148._4_2_) * local_148._4_2_;
  local_148._6_2_ = (ushort)(-1 < (short)local_148._6_2_) * local_148._6_2_;
  local_148._8_2_ = (ushort)(-1 < (short)local_148._8_2_) * local_148._8_2_;
  local_148._10_2_ = (ushort)(-1 < (short)local_148._10_2_) * local_148._10_2_;
  local_148._12_2_ = (ushort)(-1 < (short)local_148._12_2_) * local_148._12_2_;
  local_148._14_2_ = (ushort)(-1 < (short)local_148._14_2_) * local_148._14_2_;
  uVar45 = (ushort)(-1 < auVar59._0_2_) * auVar59._0_2_;
  uVar49 = (ushort)(-1 < auVar59._2_2_) * auVar59._2_2_;
  uVar50 = (ushort)(-1 < auVar59._4_2_) * auVar59._4_2_;
  uVar52 = (ushort)(-1 < auVar59._6_2_) * auVar59._6_2_;
  uVar53 = (ushort)(-1 < auVar59._8_2_) * auVar59._8_2_;
  uVar54 = (ushort)(-1 < auVar59._10_2_) * auVar59._10_2_;
  uVar55 = (ushort)(-1 < auVar59._12_2_) * auVar59._12_2_;
  uVar56 = (ushort)(-1 < auVar59._14_2_) * auVar59._14_2_;
  if (8 < n_coeffs) {
    uVar162 = (uVar150 ^ auVar90._8_4_) - auVar90._8_4_;
    uVar167 = (auVar61._12_4_ ^ auVar90._12_4_) - auVar90._12_4_;
    uVar150 = (uVar150 ^ auVar90._8_4_) - auVar90._8_4_;
    uVar170 = (auVar61._12_4_ ^ auVar90._12_4_) - auVar90._12_4_;
    uVar112 = (uVar152 ^ auVar92._8_4_) - auVar92._8_4_;
    uVar126 = (auVar130._12_4_ ^ auVar92._12_4_) - auVar92._12_4_;
    uVar127 = (uVar152 ^ auVar92._8_4_) - auVar92._8_4_;
    uVar128 = (auVar130._12_4_ ^ auVar92._12_4_) - auVar92._12_4_;
    uVar79 = (uVar143 ^ auVar64._8_4_) - auVar64._8_4_;
    uVar86 = (auVar141._12_4_ ^ auVar64._12_4_) - auVar64._12_4_;
    uVar87 = (uVar143 ^ auVar64._8_4_) - auVar64._8_4_;
    uVar88 = (auVar141._12_4_ ^ auVar64._12_4_) - auVar64._12_4_;
    lVar43 = 8;
    uVar39 = CONCAT44(auVar90._8_4_,auVar90._8_4_);
    uVar42 = CONCAT44(auVar90._12_4_,auVar90._12_4_);
    do {
      puVar1 = (uint *)(coeff_ptr + lVar43);
      puVar3 = (uint *)(coeff_ptr + lVar43 + 4);
      uVar146 = (int)*puVar1 >> 0x1f;
      uVar149 = (int)puVar1[1] >> 0x1f;
      uVar151 = (int)puVar1[2] >> 0x1f;
      uVar153 = (int)puVar1[3] >> 0x1f;
      uVar152 = (int)*puVar3 >> 0x1f;
      uVar143 = (int)puVar3[1] >> 0x1f;
      uVar144 = (int)puVar3[2] >> 0x1f;
      uVar145 = (int)puVar3[3] >> 0x1f;
      iVar46 = (*puVar1 ^ uVar146) - uVar146;
      iVar103 = (puVar1[1] ^ uVar149) - uVar149;
      iVar109 = (puVar1[2] ^ uVar151) - uVar151;
      iVar110 = (puVar1[3] ^ uVar153) - uVar153;
      iVar111 = (*puVar3 ^ uVar152) - uVar152;
      iVar156 = (puVar3[1] ^ uVar143) - uVar143;
      iVar159 = (puVar3[2] ^ uVar144) - uVar144;
      iVar160 = (puVar3[3] ^ uVar145) - uVar145;
      auVar68._0_4_ = -(uint)(iVar51 < iVar46 * 0x20);
      auVar68._4_4_ = -(uint)(iVar51 < iVar103 * 0x20);
      auVar68._8_4_ = -(uint)(iVar51 < iVar109 * 0x20);
      auVar68._12_4_ = -(uint)(iVar51 < iVar110 * 0x20);
      auVar108._0_4_ = -(uint)(iVar51 < iVar111 * 0x20);
      auVar108._4_4_ = -(uint)(iVar51 < iVar156 * 0x20);
      auVar108._8_4_ = -(uint)(iVar51 < iVar159 * 0x20);
      auVar108._12_4_ = -(uint)(iVar51 < iVar160 * 0x20);
      auVar47 = packssdw(auVar68,auVar108);
      auVar58 = (undefined1  [16])0x0;
      if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar47[0xf] < '\0'
         ) {
        auVar58 = auVar47 & *(undefined1 (*) [16])(iscan + lVar43);
        bVar44 = true;
      }
      auVar122._0_4_ = -(uint)(iVar77 < iVar46);
      auVar122._4_4_ = -(uint)(iVar78 < iVar103);
      auVar122._8_4_ = -(uint)(iVar77 < iVar109);
      auVar122._12_4_ = -(uint)(iVar78 < iVar110);
      auVar84._0_4_ = -(uint)(iVar77 < iVar111);
      auVar84._4_4_ = -(uint)(iVar78 < iVar156);
      auVar84._8_4_ = -(uint)(iVar77 < iVar159);
      auVar84._12_4_ = -(uint)(iVar78 < iVar160);
      auVar47 = packssdw(auVar122,auVar84);
      uVar57 = (ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar47[0xf] >> 7) << 0xf;
      if (uVar57 == 0) {
        auVar47 = (undefined1  [16])0x0;
      }
      else {
        auVar47 = auVar47 & *(undefined1 (*) [16])(iscan + lVar43);
        bVar11 = true;
      }
      iVar161 = movmskps((uint)uVar57,auVar84 | auVar122);
      if (iVar161 == 0) {
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar43 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar43) = (undefined1  [16])0x0;
      }
      else {
        auVar138._0_4_ = iVar46 + uVar168;
        auVar138._4_4_ = iVar103 + uVar169;
        auVar138._8_4_ = iVar109 + uVar168;
        auVar138._12_4_ = iVar110 + uVar169;
        uVar31 = CONCAT44(auVar90._8_4_,auVar90._8_4_);
        uVar32 = CONCAT44(auVar90._12_4_,auVar90._12_4_);
        auVar69._0_4_ =
             (int)(((ulong)auVar138._0_4_ * (ulong)uVar162 ^ uVar39) - uVar39 >> 0x10) +
             auVar138._0_4_;
        auVar69._4_4_ =
             (int)(((ulong)auVar138._4_4_ * (ulong)uVar167 ^ uVar31) - uVar31 >> 0x10) +
             auVar138._4_4_;
        auVar69._8_4_ =
             (int)(((auVar138._8_8_ & 0xffffffff) * (ulong)uVar150 ^ uVar42) - uVar42 >> 0x10) +
             auVar138._8_4_;
        auVar69._12_4_ =
             (int)(((auVar138._8_8_ >> 0x20) * (ulong)uVar170 ^ uVar32) - uVar32 >> 0x10) +
             auVar138._12_4_;
        uVar29 = CONCAT44(auVar92._8_4_,auVar92._8_4_);
        uVar30 = CONCAT44(auVar92._12_4_,auVar92._12_4_);
        uVar27 = CONCAT44(auVar92._8_4_,auVar92._8_4_);
        uVar28 = CONCAT44(auVar92._12_4_,auVar92._12_4_);
        auVar166._0_4_ = iVar111 + uVar168;
        auVar166._4_4_ = iVar156 + uVar169;
        auVar166._8_4_ = iVar159 + uVar168;
        auVar166._12_4_ = iVar160 + uVar169;
        auVar70._0_4_ =
             (int)(((ulong)auVar166._0_4_ * (ulong)uVar162 ^ uVar39) - uVar39 >> 0x10) +
             auVar166._0_4_;
        auVar70._4_4_ =
             (int)(((ulong)auVar166._4_4_ * (ulong)uVar167 ^ uVar31) - uVar31 >> 0x10) +
             auVar166._4_4_;
        auVar70._8_4_ =
             (int)(((auVar166._8_8_ & 0xffffffff) * (ulong)uVar150 ^ uVar42) - uVar42 >> 0x10) +
             auVar166._8_4_;
        auVar70._12_4_ =
             (int)(((auVar166._8_8_ >> 0x20) * (ulong)uVar170 ^ uVar32) - uVar32 >> 0x10) +
             auVar166._12_4_;
        auVar100._0_4_ =
             ((uint)(((ulong)auVar69._0_4_ * (ulong)uVar112 ^ uVar29) - uVar29 >> 0xf) ^ uVar146) -
             uVar146;
        auVar100._4_4_ =
             ((uint)((((ulong)auVar69._4_4_ * (ulong)uVar126 ^ uVar27) - uVar27) * 0x20000 >> 0x20)
             ^ uVar149) - uVar149;
        auVar100._8_4_ =
             ((uint)(((auVar69._8_8_ & 0xffffffff) * (ulong)uVar127 ^ uVar30) - uVar30 >> 0xf) ^
             uVar151) - uVar151;
        auVar100._12_4_ =
             ((uint)((((auVar69._8_8_ >> 0x20) * (ulong)uVar128 ^ uVar28) - uVar28) * 0x20000 >>
                    0x20) ^ uVar153) - uVar153;
        auVar139._0_4_ =
             ((uint)(((ulong)auVar70._0_4_ * (ulong)uVar112 ^ uVar29) - uVar29 >> 0xf) ^ uVar152) -
             uVar152;
        auVar139._4_4_ =
             ((uint)((((ulong)auVar70._4_4_ * (ulong)uVar126 ^ uVar27) - uVar27) * 0x20000 >> 0x20)
             ^ uVar143) - uVar143;
        auVar139._8_4_ =
             ((uint)(((auVar70._8_8_ & 0xffffffff) * (ulong)uVar127 ^ uVar30) - uVar30 >> 0xf) ^
             uVar144) - uVar144;
        auVar139._12_4_ =
             ((uint)((((auVar70._8_8_ >> 0x20) * (ulong)uVar128 ^ uVar28) - uVar28) * 0x20000 >>
                    0x20) ^ uVar145) - uVar145;
        auVar122 = auVar122 & auVar100;
        auVar84 = auVar84 & auVar139;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43) = auVar122;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43 + 4) = auVar84;
        auVar101._0_4_ = auVar122._0_4_ >> 0x1f;
        auVar101._4_4_ = auVar122._4_4_ >> 0x1f;
        auVar101._8_4_ = auVar122._8_4_ >> 0x1f;
        auVar101._12_4_ = auVar122._12_4_ >> 0x1f;
        auVar122 = auVar122 ^ auVar101;
        auVar123._0_4_ = auVar122._0_4_ - auVar101._0_4_;
        auVar123._4_4_ = auVar122._4_4_ - auVar101._4_4_;
        auVar123._8_4_ = auVar122._8_4_ - auVar101._8_4_;
        auVar123._12_4_ = auVar122._12_4_ - auVar101._12_4_;
        uVar29 = CONCAT44(auVar64._8_4_,auVar64._8_4_);
        uVar30 = CONCAT44(auVar64._12_4_,auVar64._12_4_);
        uVar27 = CONCAT44(auVar64._8_4_,auVar64._8_4_);
        uVar28 = CONCAT44(auVar64._12_4_,auVar64._12_4_);
        auVar72._0_4_ = (undefined4)(((ulong)auVar123._0_4_ * (ulong)uVar79 ^ uVar29) - uVar29 >> 1)
        ;
        auVar71._8_4_ =
             (undefined4)(((auVar123._8_8_ & 0xffffffff) * (ulong)uVar87 ^ uVar30) - uVar30 >> 1);
        auVar71._4_4_ = auVar71._8_4_;
        auVar71._0_4_ = auVar72._0_4_;
        auVar71._12_4_ =
             (int)((((auVar123._8_8_ >> 0x20) * (ulong)uVar88 ^ uVar28) - uVar28) * 0x80000000 >>
                  0x20);
        auVar72._8_8_ = auVar71._8_8_;
        auVar72._4_4_ =
             (int)((((ulong)auVar123._4_4_ * (ulong)uVar86 ^ uVar27) - uVar27) * 0x80000000 >> 0x20)
        ;
        auVar72 = auVar72 ^ auVar101;
        auVar102._0_4_ = auVar84._0_4_ >> 0x1f;
        auVar102._4_4_ = auVar84._4_4_ >> 0x1f;
        auVar102._8_4_ = auVar84._8_4_ >> 0x1f;
        auVar102._12_4_ = auVar84._12_4_ >> 0x1f;
        auVar84 = auVar84 ^ auVar102;
        auVar85._0_4_ = auVar84._0_4_ - auVar102._0_4_;
        auVar85._4_4_ = auVar84._4_4_ - auVar102._4_4_;
        auVar85._8_4_ = auVar84._8_4_ - auVar102._8_4_;
        auVar85._12_4_ = auVar84._12_4_ - auVar102._12_4_;
        auVar125._0_4_ = (undefined4)(((ulong)auVar85._0_4_ * (ulong)uVar79 ^ uVar29) - uVar29 >> 1)
        ;
        auVar124._8_4_ =
             (undefined4)(((auVar85._8_8_ & 0xffffffff) * (ulong)uVar87 ^ uVar30) - uVar30 >> 1);
        auVar124._4_4_ = auVar124._8_4_;
        auVar124._0_4_ = auVar125._0_4_;
        auVar124._12_4_ =
             (int)((((auVar85._8_8_ >> 0x20) * (ulong)uVar88 ^ uVar28) - uVar28) * 0x80000000 >>
                  0x20);
        auVar125._8_8_ = auVar124._8_8_;
        auVar125._4_4_ =
             (int)((((ulong)auVar85._4_4_ * (ulong)uVar86 ^ uVar27) - uVar27) * 0x80000000 >> 0x20);
        auVar125 = auVar125 ^ auVar102;
        piVar2 = dqcoeff_ptr + lVar43;
        *piVar2 = auVar72._0_4_ - auVar101._0_4_;
        piVar2[1] = auVar72._4_4_ - auVar101._4_4_;
        piVar2[2] = auVar72._8_4_ - auVar101._8_4_;
        piVar2[3] = auVar72._12_4_ - auVar101._12_4_;
        piVar2 = dqcoeff_ptr + lVar43 + 4;
        *piVar2 = auVar125._0_4_ - auVar102._0_4_;
        piVar2[1] = auVar125._4_4_ - auVar102._4_4_;
        piVar2[2] = auVar125._8_4_ - auVar102._8_4_;
        piVar2[3] = auVar125._12_4_ - auVar102._12_4_;
      }
      sVar48 = auVar58._0_2_;
      sVar4 = auVar58._2_2_;
      sVar5 = auVar58._4_2_;
      sVar6 = auVar58._6_2_;
      sVar7 = auVar58._8_2_;
      sVar8 = auVar58._10_2_;
      sVar9 = auVar58._12_2_;
      sVar10 = auVar58._14_2_;
      local_148._2_2_ =
           (ushort)((short)local_148._2_2_ < sVar4) * sVar4 |
           (ushort)((short)local_148._2_2_ >= sVar4) * local_148._2_2_;
      local_148._0_2_ =
           (ushort)((short)local_148._0_2_ < sVar48) * sVar48 |
           (ushort)((short)local_148._0_2_ >= sVar48) * local_148._0_2_;
      local_148._4_2_ =
           (ushort)((short)local_148._4_2_ < sVar5) * sVar5 |
           (ushort)((short)local_148._4_2_ >= sVar5) * local_148._4_2_;
      local_148._6_2_ =
           (ushort)((short)local_148._6_2_ < sVar6) * sVar6 |
           (ushort)((short)local_148._6_2_ >= sVar6) * local_148._6_2_;
      local_148._8_2_ =
           (ushort)((short)local_148._8_2_ < sVar7) * sVar7 |
           (ushort)((short)local_148._8_2_ >= sVar7) * local_148._8_2_;
      local_148._10_2_ =
           (ushort)((short)local_148._10_2_ < sVar8) * sVar8 |
           (ushort)((short)local_148._10_2_ >= sVar8) * local_148._10_2_;
      local_148._12_2_ =
           (ushort)((short)local_148._12_2_ < sVar9) * sVar9 |
           (ushort)((short)local_148._12_2_ >= sVar9) * local_148._12_2_;
      local_148._14_2_ =
           (ushort)((short)local_148._14_2_ < sVar10) * sVar10 |
           (ushort)((short)local_148._14_2_ >= sVar10) * local_148._14_2_;
      sVar48 = auVar47._0_2_;
      uVar45 = (ushort)((short)uVar45 < sVar48) * sVar48 | ((short)uVar45 >= sVar48) * uVar45;
      sVar48 = auVar47._2_2_;
      uVar49 = (ushort)((short)uVar49 < sVar48) * sVar48 | ((short)uVar49 >= sVar48) * uVar49;
      sVar48 = auVar47._4_2_;
      uVar50 = (ushort)((short)uVar50 < sVar48) * sVar48 | ((short)uVar50 >= sVar48) * uVar50;
      sVar48 = auVar47._6_2_;
      uVar52 = (ushort)((short)uVar52 < sVar48) * sVar48 | ((short)uVar52 >= sVar48) * uVar52;
      sVar48 = auVar47._8_2_;
      uVar53 = (ushort)((short)uVar53 < sVar48) * sVar48 | ((short)uVar53 >= sVar48) * uVar53;
      sVar48 = auVar47._10_2_;
      uVar54 = (ushort)((short)uVar54 < sVar48) * sVar48 | ((short)uVar54 >= sVar48) * uVar54;
      sVar48 = auVar47._12_2_;
      uVar55 = (ushort)((short)uVar55 < sVar48) * sVar48 | ((short)uVar55 >= sVar48) * uVar55;
      sVar48 = auVar47._14_2_;
      uVar56 = (ushort)((short)uVar56 < sVar48) * sVar48 | ((short)uVar56 >= sVar48) * uVar56;
      lVar43 = lVar43 + 8;
    } while (lVar43 < n_coeffs);
  }
  if (bVar44) {
    uVar57 = (ushort)((short)local_148._8_2_ < (short)local_148._0_2_) * local_148._0_2_ |
             (ushort)((short)local_148._8_2_ >= (short)local_148._0_2_) * local_148._8_2_;
    uVar73 = (ushort)((short)local_148._10_2_ < (short)local_148._2_2_) * local_148._2_2_ |
             (ushort)((short)local_148._10_2_ >= (short)local_148._2_2_) * local_148._10_2_;
    uVar74 = (ushort)((short)local_148._12_2_ < (short)local_148._4_2_) * local_148._4_2_ |
             (ushort)((short)local_148._12_2_ >= (short)local_148._4_2_) * local_148._12_2_;
    uVar75 = (ushort)((short)local_148._14_2_ < (short)local_148._6_2_) * local_148._6_2_ |
             (ushort)((short)local_148._14_2_ >= (short)local_148._6_2_) * local_148._14_2_;
    uVar57 = ((short)uVar74 < (short)uVar57) * uVar57 | ((short)uVar74 >= (short)uVar57) * uVar74;
    uVar73 = ((short)uVar75 < (short)uVar73) * uVar73 | ((short)uVar75 >= (short)uVar73) * uVar75;
    uVar79 = (ushort)(((short)uVar73 < (short)uVar57) * uVar57 |
                     ((short)uVar73 >= (short)uVar57) * uVar73) + 1;
  }
  else {
    uVar79 = 0;
  }
  if (bVar11) {
    uVar53 = ((short)uVar53 < (short)uVar45) * uVar45 | ((short)uVar53 >= (short)uVar45) * uVar53;
    uVar54 = ((short)uVar54 < (short)uVar49) * uVar49 | ((short)uVar54 >= (short)uVar49) * uVar54;
    uVar49 = ((short)uVar55 < (short)uVar50) * uVar50 | ((short)uVar55 >= (short)uVar50) * uVar55;
    uVar50 = ((short)uVar56 < (short)uVar52) * uVar52 | ((short)uVar56 >= (short)uVar52) * uVar56;
    uVar49 = ((short)uVar49 < (short)uVar53) * uVar53 | ((short)uVar49 >= (short)uVar53) * uVar49;
    uVar50 = ((short)uVar50 < (short)uVar54) * uVar54 | ((short)uVar50 >= (short)uVar54) * uVar50;
    uVar86 = (uint)(ushort)(((short)uVar50 < (short)uVar49) * uVar49 |
                           ((short)uVar50 >= (short)uVar49) * uVar50);
  }
  else {
    uVar86 = 0xffffffff;
  }
  if ((int)uVar79 <= (int)uVar86) {
    iVar46 = uVar86 + 1;
    psVar41 = scan + uVar86;
    do {
      sVar48 = *psVar41;
      qcoeff_ptr[sVar48] = 0;
      dqcoeff_ptr[sVar48] = 0;
      iVar46 = iVar46 + -1;
      psVar41 = psVar41 + -1;
    } while ((int)uVar79 < iVar46);
  }
  uVar42 = 0xffffffff;
  uVar39 = (ulong)uVar79;
  do {
    iVar46 = (int)uVar42;
    if ((long)uVar39 < 1) break;
    lVar43 = uVar39 - 1;
    uVar39 = uVar39 - 1;
    if (qcoeff_ptr[scan[lVar43]] != 0) {
      uVar42 = uVar39 & 0xffffffff;
    }
    iVar46 = (int)uVar42;
  } while (qcoeff_ptr[scan[lVar43]] == 0);
  uVar40 = (uint16_t)(iVar46 + 1U);
  *eob_ptr = uVar40;
  if (uVar79 == 0) {
    uVar86 = 0xffffffff;
  }
  else {
    lVar43 = 0;
    do {
      uVar86 = (uint)lVar43;
      if (qcoeff_ptr[scan[lVar43]] != 0) break;
      bVar44 = (ulong)uVar79 - 1 != lVar43;
      lVar43 = lVar43 + 1;
      uVar86 = 0xffffffff;
    } while (bVar44);
  }
  if ((uVar40 != 0) && (uVar79 = (iVar46 + 1U & 0xffff) - 1, uVar86 == uVar79)) {
    sVar48 = scan[uVar79];
    if (((qcoeff_ptr[sVar48] == 1) || (qcoeff_ptr[sVar48] == -1)) &&
       (uVar79 = coeff_ptr[sVar48] >> 0x1f,
       (int)((coeff_ptr[sVar48] << 5 ^ uVar79) - uVar79) <
       *(int *)((long)local_110 + (ulong)(sVar48 != 0) * 4) * 0x20 +
       (dequant_ptr[sVar48 != 0] * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar48] = 0;
      dqcoeff_ptr[sVar48] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_32x32_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 8;
  const int log_scale = 1;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);
  const __m128i log_scale_vec = _mm_set1_epi32(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, cmp_mask;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  __m128i zbin_sign = _mm_srai_epi16(zbin, 15);
  __m128i round_sign = _mm_srai_epi16(round, 15);
  __m128i quant_sign = _mm_srai_epi16(quant, 15);
  __m128i dequant_sign = _mm_srai_epi16(dequant, 15);
  __m128i shift_sign = _mm_srai_epi16(shift, 15);

  zbin = _mm_unpacklo_epi16(zbin, zbin_sign);
  round = _mm_unpacklo_epi16(round, round_sign);
  quant = _mm_unpacklo_epi16(quant, quant_sign);
  dequant = _mm_unpacklo_epi16(dequant, dequant_sign);
  shift = _mm_unpacklo_epi16(shift, shift_sign);

  // Shift with rounding.
  zbin = _mm_add_epi32(zbin, log_scale_vec);
  round = _mm_add_epi32(round, log_scale_vec);
  zbin = _mm_srli_epi32(zbin, log_scale);
  round = _mm_srli_epi32(round, log_scale);
  zbin = _mm_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm_load_si128((__m128i *)(coeff_ptr));
  coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + 4));

  coeff0_sign = _mm_srai_epi32(coeff0, 31);
  coeff1_sign = _mm_srai_epi32(coeff1, 31);
  qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

  highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
  highbd_update_mask1(&cmp_mask, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), coeff1);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm_load_si128((__m128i *)(coeff_ptr + index));
    coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + index + 4));

    coeff0_sign = _mm_srai_epi32(coeff0, 31);
    coeff1_sign = _mm_srai_epi32(coeff1, 31);
    qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

    highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index,
                        &is_found0, &mask0);

    cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
    highbd_update_mask1(&cmp_mask, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      index += 8;
      continue;
    }
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr + index), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);

    _mm_store_si128((__m128i *)(dqcoeff_ptr + index), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), coeff1);

    index += 8;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}